

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O2

int Mpm_CutComputeDsd6(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                      Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  word wVar7;
  word Truth;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint local_48 [6];
  
  local_48[0] = 0xffffffff;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_48[5] = 0xffffffff;
  uVar2 = *(uint *)&pCut0->field_0x4 >> 1 & 0xffffff;
  uVar9 = *(uint *)&pCut1->field_0x4 >> 1 & 0xffffff;
  if (pCutC == (Mpm_Cut_t *)0x0) {
    uVar10 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar2 << 5));
    iVar3 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[1]);
    wVar7 = Vec_WrdEntry(p->vPerm6,uVar9 * 0x2d0 + iVar3);
    uVar2 = p->uComplMask[1];
    if (uVar2 != 0) {
      for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
        if ((uVar2 >> (uVar9 & 0x1f) & 1) != 0) {
          wVar7 = Abc_Tt6Flip(wVar7,uVar9);
        }
      }
    }
    uVar2 = *(uint *)&pCut0->field_0x4;
    uVar9 = Abc_LitIsCompl(uVar2 & 0x1ffffff);
    uVar10 = uVar10 ^ -(ulong)((uVar9 ^ uVar2 >> 0x19 & 1) != fCompl0);
    uVar2 = *(uint *)&pCut1->field_0x4;
    uVar9 = Abc_LitIsCompl(uVar2 & 0x1ffffff);
    uVar8 = -(ulong)((uVar9 ^ uVar2 >> 0x19 & 1) != fCompl1) ^ wVar7;
    if (Type == 2) {
      wVar7 = uVar8 ^ uVar10;
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x3bc,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      wVar7 = uVar8 & uVar10;
    }
  }
  else {
    uVar5 = *(uint *)&pCutC->field_0x4;
    uVar10 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar2 << 5));
    iVar3 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[1]);
    iVar4 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[2]);
    wVar7 = Vec_WrdEntry(p->vPerm6,uVar9 * 0x2d0 + iVar3);
    Truth = Vec_WrdEntry(p->vPerm6,(uVar5 >> 1 & 0xffffff) * 0x2d0 + iVar4);
    uVar2 = p->uComplMask[1];
    if (uVar2 != 0) {
      for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
        if ((uVar2 >> (uVar9 & 0x1f) & 1) != 0) {
          wVar7 = Abc_Tt6Flip(wVar7,uVar9);
        }
      }
    }
    uVar2 = p->uComplMask[2];
    if (uVar2 != 0) {
      for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
        if ((uVar2 >> (uVar9 & 0x1f) & 1) != 0) {
          Truth = Abc_Tt6Flip(Truth,uVar9);
        }
      }
    }
    uVar2 = *(uint *)&pCut0->field_0x4;
    uVar9 = Abc_LitIsCompl(uVar2 & 0x1ffffff);
    uVar10 = uVar10 ^ -(ulong)((uVar9 ^ uVar2 >> 0x19 & 1) != fCompl0);
    uVar2 = *(uint *)&pCut1->field_0x4;
    uVar5 = Abc_LitIsCompl(uVar2 & 0x1ffffff);
    uVar9 = *(uint *)&pCutC->field_0x4;
    uVar6 = Abc_LitIsCompl(uVar9 & 0x1ffffff);
    wVar7 = (wVar7 ^ -(ulong)((uVar5 ^ uVar2 >> 0x19 & 1) != fCompl1) ^ uVar10) &
            (-(ulong)((uVar9 >> 0x19 & 1 ^ fComplC) != uVar6) ^ Truth) ^ uVar10;
  }
  uVar2 = Mpm_CutCheckDsd6(p,wVar7);
  if (uVar2 == 0xffffffff) {
    p->nNonDsd = p->nNonDsd + 1;
LAB_006d32da:
    iVar3 = 0;
  }
  else {
    uVar9 = (int)uVar2 >> 0x11;
    if (p->pPars->fMap4Gates == 0) {
      if ((int)uVar9 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
    }
    else {
      if (((int)uVar9 < 0) || (p->vNpnConfigs->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (p->vNpnConfigs->pArray[uVar9].nSize == 0) {
        p->nNoMatch = p->nNoMatch + 1;
        goto LAB_006d32da;
      }
    }
    uVar5 = uVar2 & 0xffff;
    uVar2 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar2 >> 0x10 & 1) + uVar9 * 2;
    *(uint *)&pCut->field_0x4 = uVar2;
    if (0xb3ff < uVar5) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                    ,0x405,
                    "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    for (uVar10 = 0; uVar2 >> 0x1b != uVar10; uVar10 = uVar10 + 1) {
      if (pCut->pLeaves[uVar10] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      local_48[p->Perm6[uVar5 >> 6][uVar10]] =
           pCut->pLeaves[uVar10] ^ (uint)((uVar5 >> ((uint)uVar10 & 0x1f) & 1) != 0);
    }
    uVar5 = p->pDsd6[(int)uVar9].nVars;
    *(uint *)&pCut->field_0x4 = uVar2 & 0x7ffffff | uVar5 << 0x1b;
    uVar8 = (ulong)(uVar5 & 0x1f);
    uVar10 = 0;
    while (uVar8 != uVar10) {
      puVar1 = local_48 + uVar10;
      uVar10 = uVar10 + 1;
      if (*puVar1 == 0xffffffff) {
        __assert_fail("pLeavesNew[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x40a,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
    }
    for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      pCut->pLeaves[uVar10] = local_48[uVar10];
    }
    p->nCountDsd[(int)uVar9] = p->nCountDsd[(int)uVar9] + 1;
    p->nSmallSupp = p->nSmallSupp + (uint)(*(uint *)&pCut->field_0x4 < 0x10000000);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Mpm_CutComputeDsd6( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int fVerbose = 0;
    int i, Config, iClass, fCompl;
    int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
    word t = 0;
    if ( pCutC == NULL )
    {
        word t0, t1;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        if ( Type == 1 )
            t = t0 & t1;
        else if ( Type == 2 )
            t = t0 ^ t1;
        else assert( 0 );

if ( fVerbose )
{
Mpm_ManPrintPerm( p->uPermMask[1] );               printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
    }
    else
    {
        word t0, t1, tC;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        int iClassC  = Abc_Lit2Var(pCutC->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        int PermC    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[2] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        word TruthCp = Vec_WrdEntry( p->vPerm6, iClassC * 720 + PermC );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        if ( p->uComplMask[2] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[2] >> i) & 1 )
                    TruthCp = Abc_Tt6Flip( TruthCp, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        tC = (fComplC ^ pCutC->fCompl ^ Abc_LitIsCompl(pCutC->iFunc)) ? ~TruthCp : TruthCp;
        t = (tC & t1) | (~tC & t0);
    }

    // find configuration
    Config = Mpm_CutCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return 0;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // check if the gate exists
    if ( p->pPars->fMap4Gates )
    {
        if ( Vec_IntSize(Vec_WecEntry(p->vNpnConfigs, iClass)) == 0 )
        {
            p->nNoMatch++;
            return 0;
        }
    }

    // set the function
    pCut->iFunc = Abc_Var2Lit( iClass, fCompl );

if ( fVerbose )
{
Mpm_CutPrint( pCut0 );
Mpm_CutPrint( pCut1 );
Mpm_CutPrint( pCut );
}

    // update cut
    assert( (Config >> 6) < 720 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut->pLeaves[i], (Config >> i) & 1 );
    pCut->nLeaves = p->pDsd6[iClass].nVars;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        assert( pLeavesNew[i] != -1 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pCut->pLeaves[i] = pLeavesNew[i];
    p->nCountDsd[iClass]++;
    p->nSmallSupp += (int)(pCut->nLeaves < 2);

if ( fVerbose )
{
printf( "Computed " );
Mpm_CutPrint( pCut );
printf( "\n" );
}
    return 1;
}